

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O2

XrResult GenValidUsageInputsXrCreateFacialTrackerHTC
                   (XrSession session,XrFacialTrackerCreateInfoHTC *createInfo,
                   XrFacialTrackerHTC *facialTracker)

{
  ValidateXrHandleResult VVar1;
  XrResult XVar2;
  GenValidUsageXrInstanceInfo *instance_info;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *this;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> pVar3;
  XrSession_T *in_stack_fffffffffffffd78;
  string local_280;
  string local_260;
  XrSession session_local;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> objects_info;
  string local_218;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1f8;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1e0;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1c8;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1b0;
  ostringstream oss;
  
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  _oss = 2;
  session_local = session;
  std::vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>>::
  emplace_back<XrSession_T*&,XrObjectType>
            ((vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>> *)
             &objects_info,&session_local,(XrObjectType *)&oss);
  VVar1 = VerifyXrSessionHandle(&session_local);
  if (VVar1 == VALIDATE_XR_HANDLE_SUCCESS) {
    pVar3 = HandleInfo<XrSession_T_*>::getWithInstanceInfo(&g_session_info,session_local);
    instance_info = pVar3.second;
    if (createInfo == (XrFacialTrackerCreateInfoHTC *)0x0) {
      std::__cxx11::string::string
                ((string *)&oss,"VUID-xrCreateFacialTrackerHTC-createInfo-parameter",
                 (allocator *)&local_218);
      std::__cxx11::string::string
                ((string *)&local_280,"xrCreateFacialTrackerHTC",
                 (allocator *)&stack0xfffffffffffffd7f);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_1c8,&objects_info);
      std::__cxx11::string::string
                ((string *)&local_260,
                 "Invalid NULL for XrFacialTrackerCreateInfoHTC \"createInfo\" which is not optional and must be non-NULL"
                 ,(allocator *)&stack0xfffffffffffffd7e);
      CoreValidLogMessage(instance_info,(string *)&oss,VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_280,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&local_1c8,&local_260);
      std::__cxx11::string::~string((string *)&local_260);
      this = &local_1c8;
    }
    else {
      std::__cxx11::string::string
                ((string *)&oss,"xrCreateFacialTrackerHTC",(allocator *)&local_280);
      XVar2 = ValidateXrStruct(instance_info,(string *)&oss,&objects_info,true,true,createInfo);
      std::__cxx11::string::~string((string *)&oss);
      if (XVar2 == XR_SUCCESS) {
        XVar2 = XR_SUCCESS;
        if (facialTracker != (XrFacialTrackerHTC *)0x0) goto LAB_001dfb15;
        std::__cxx11::string::string
                  ((string *)&oss,"VUID-xrCreateFacialTrackerHTC-facialTracker-parameter",
                   (allocator *)&local_218);
        std::__cxx11::string::string
                  ((string *)&local_280,"xrCreateFacialTrackerHTC",
                   (allocator *)&stack0xfffffffffffffd7f);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   &local_1f8,&objects_info);
        std::__cxx11::string::string
                  ((string *)&local_260,
                   "Invalid NULL for XrFacialTrackerHTC \"facialTracker\" which is not optional and must be non-NULL"
                   ,(allocator *)&stack0xfffffffffffffd7e);
        CoreValidLogMessage(instance_info,(string *)&oss,VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_280
                            ,(vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                              *)&local_1f8,&local_260);
        std::__cxx11::string::~string((string *)&local_260);
        this = &local_1f8;
      }
      else {
        std::__cxx11::string::string
                  ((string *)&oss,"VUID-xrCreateFacialTrackerHTC-createInfo-parameter",
                   (allocator *)&local_218);
        std::__cxx11::string::string
                  ((string *)&local_280,"xrCreateFacialTrackerHTC",
                   (allocator *)&stack0xfffffffffffffd7f);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   &local_1e0,&objects_info);
        std::__cxx11::string::string
                  ((string *)&local_260,
                   "Command xrCreateFacialTrackerHTC param createInfo is invalid",
                   (allocator *)&stack0xfffffffffffffd7e);
        CoreValidLogMessage(instance_info,(string *)&oss,VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_280
                            ,(vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                              *)&local_1e0,&local_260);
        std::__cxx11::string::~string((string *)&local_260);
        this = &local_1e0;
      }
    }
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(this);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::~string((string *)&oss);
    XVar2 = XR_ERROR_VALIDATION_FAILURE;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    std::operator<<((ostream *)&oss,"Invalid XrSession handle \"session\" ");
    HandleToHexString<XrSession_T*>(in_stack_fffffffffffffd78);
    std::operator<<((ostream *)&oss,(string *)&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::string
              ((string *)&local_280,"VUID-xrCreateFacialTrackerHTC-session-parameter",
               (allocator *)&stack0xfffffffffffffd7f);
    std::__cxx11::string::string
              ((string *)&local_260,"xrCreateFacialTrackerHTC",(allocator *)&stack0xfffffffffffffd7e
              );
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_1b0,&objects_info);
    std::__cxx11::stringbuf::str();
    CoreValidLogMessage((GenValidUsageXrInstanceInfo *)0x0,&local_280,
                        VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_260,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_1b0,&local_218);
    std::__cxx11::string::~string((string *)&local_218);
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(&local_1b0);
    std::__cxx11::string::~string((string *)&local_260);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
    XVar2 = XR_ERROR_HANDLE_INVALID;
  }
LAB_001dfb15:
  std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
  ~_Vector_base(&objects_info.
                 super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
               );
  return XVar2;
}

Assistant:

XrResult GenValidUsageInputsXrCreateFacialTrackerHTC(
XrSession session,
const XrFacialTrackerCreateInfoHTC* createInfo,
XrFacialTrackerHTC* facialTracker) {
    try {
        XrResult xr_result = XR_SUCCESS;
        std::vector<GenValidUsageXrObjectInfo> objects_info;
        objects_info.emplace_back(session, XR_OBJECT_TYPE_SESSION);

        {
            // writeValidateInlineHandleValidation
            ValidateXrHandleResult handle_result = VerifyXrSessionHandle(&session);
            if (handle_result != VALIDATE_XR_HANDLE_SUCCESS) {
                // Not a valid handle or NULL (which is not valid in this case)
                std::ostringstream oss;
                oss << "Invalid XrSession handle \"session\" ";
                oss << HandleToHexString(session);
                CoreValidLogMessage(nullptr, "VUID-xrCreateFacialTrackerHTC-session-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrCreateFacialTrackerHTC",
                                    objects_info, oss.str());
                return XR_ERROR_HANDLE_INVALID;
            }
        }
        auto info_with_instance = g_session_info.getWithInstanceInfo(session);
        GenValidUsageXrHandleInfo *gen_session_info = info_with_instance.first;
        (void)gen_session_info;  // quiet warnings
        GenValidUsageXrInstanceInfo *gen_instance_info = info_with_instance.second;
        (void)gen_instance_info;  // quiet warnings
        // Non-optional pointer/array variable that needs to not be NULL
        if (nullptr == createInfo) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrCreateFacialTrackerHTC-createInfo-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrCreateFacialTrackerHTC", objects_info,
                                "Invalid NULL for XrFacialTrackerCreateInfoHTC \"createInfo\" which is not "
                                "optional and must be non-NULL");
            return XR_ERROR_VALIDATION_FAILURE;
        }
        // Validate that the structure XrFacialTrackerCreateInfoHTC is valid
        xr_result = ValidateXrStruct(gen_instance_info, "xrCreateFacialTrackerHTC", objects_info,
                                                        true, true, createInfo);
        if (XR_SUCCESS != xr_result) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrCreateFacialTrackerHTC-createInfo-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrCreateFacialTrackerHTC",
                                objects_info,
                                "Command xrCreateFacialTrackerHTC param createInfo is invalid");
            return xr_result;
        }
        // Non-optional pointer/array variable that needs to not be NULL
        if (nullptr == facialTracker) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrCreateFacialTrackerHTC-facialTracker-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrCreateFacialTrackerHTC", objects_info,
                                "Invalid NULL for XrFacialTrackerHTC \"facialTracker\" which is not "
                                "optional and must be non-NULL");
            return XR_ERROR_VALIDATION_FAILURE;
        }
        return xr_result;
    } catch (...) {
        return XR_ERROR_VALIDATION_FAILURE;
    }
}